

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsDatastore.cc
# Opt level: O2

void LongReadsDatastore::build_from_fastq
               (string *output_file,string *default_name,string *long_read_file,size_t min_size,
               int rle)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  bool bVar3;
  ostream *poVar4;
  int *piVar5;
  char *pcVar6;
  runtime_error *prVar7;
  char cVar8;
  int iVar9;
  char cVar10;
  size_type sVar11;
  initializer_list<ReadPosSize> __l;
  uint32_t size;
  uint64_t nReads;
  int local_5f0;
  SDG_FILETYPE type;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> mappings;
  uint8_t k;
  uint64_t fPos;
  vector<ReadPosSize,_std::allocator<ReadPosSize>_> read_to_file_record;
  FastqRecord rec;
  ofstream ofs;
  byte abStack_4f0 [480];
  FastqReader<FastqRecord> reader;
  ifstream fastq_ifstream;
  byte abStack_218 [488];
  
  _fastq_ifstream = (pointer)0x0;
  nReads = 1;
  __l._M_len = 1;
  __l._M_array = (iterator)&fastq_ifstream;
  std::vector<ReadPosSize,_std::allocator<ReadPosSize>_>::vector
            (&read_to_file_record,__l,(allocator_type *)&ofs);
  std::ofstream::ofstream(&ofs,(string *)output_file,_S_trunc|_S_out|_S_bin);
  if ((abStack_4f0[*(long *)(_ofs + -0x18)] & 5) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to open output in ");
    poVar4 = std::operator<<(poVar4,(string *)output_file);
    poVar4 = std::operator<<(poVar4,": ");
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    std::operator<<(poVar4,pcVar6);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &fastq_ifstream,"Could not open ",output_file);
    std::runtime_error::runtime_error(prVar7,(string *)&fastq_ifstream);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ostream::write((char *)&ofs,0x2512dc);
  std::ostream::write((char *)&ofs,0x2512de);
  type = LongDS_FT;
  std::ostream::write((char *)&ofs,(long)&type);
  std::ostream::write((char *)&ofs,(long)&nReads);
  std::ostream::write((char *)&ofs,(long)&fPos);
  sdglib::write_string(&ofs,default_name);
  std::ifstream::ifstream(&fastq_ifstream,(string *)long_read_file,_S_in);
  if ((abStack_218[*(long *)(_fastq_ifstream + -0x18)] & 5) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to open input in ");
    poVar4 = std::operator<<(poVar4,(string *)long_read_file);
    poVar4 = std::operator<<(poVar4,": ");
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    std::operator<<(poVar4,pcVar6);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                   "Could not open ",long_read_file);
    std::runtime_error::runtime_error(prVar7,(string *)&reader);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  FastqReader<FastqRecord>::FastqReader(&reader,(FastxReaderParams)0x0,long_read_file);
  rec.name._M_dataplus._M_p = (pointer)&rec.name.field_2;
  rec.name._M_string_length = 0;
  rec.name.field_2._M_local_buf[0] = '\0';
  rec.comment._M_dataplus._M_p = (pointer)&rec.comment.field_2;
  rec.comment._M_string_length = 0;
  rec.comment.field_2._M_local_buf[0] = '\0';
  rec.seq._M_dataplus._M_p = (pointer)&rec.seq.field_2;
  rec.seq._M_string_length = 0;
  rec.seq.field_2._M_local_buf[0] = '\0';
  rec.qual._M_dataplus._M_p = (pointer)&rec.qual.field_2;
  rec.qual._M_string_length = 0;
  rec.qual.field_2._M_local_buf[0] = '\0';
  local_5f0 = rle;
  while (bVar3 = FastqReader<FastqRecord>::next_record(&reader,&rec), bVar3) {
    if (min_size <= rec.seq._M_string_length && rec.seq._M_string_length != 0) {
      mappings.super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&mappings.super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
      mappings.super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      mappings.super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)mappings.
                            super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
      std::__cxx11::string::reserve((ulong)&mappings);
      sVar2 = rec.seq._M_string_length;
      _Var1 = rec.seq._M_dataplus;
      iVar9 = 0;
      cVar10 = ' ';
      for (sVar11 = 0; sVar2 != sVar11; sVar11 = sVar11 + 1) {
        cVar8 = _Var1._M_p[sVar11];
        if ((((cVar8 != 'A') && (cVar8 != 'C')) && (cVar8 != 'G')) && (cVar8 != 'T')) {
          if (cVar8 == 't') {
            cVar8 = 'T';
          }
          else if (cVar8 == 'c') {
            cVar8 = 'C';
          }
          else if (cVar8 == 'g') {
            cVar8 = 'G';
          }
          else if (cVar8 == 'a') {
            cVar8 = 'A';
          }
          else {
            cVar8 = 'N';
          }
        }
        if (local_5f0 == 0) {
          std::__cxx11::string::push_back((char)&mappings);
          cVar8 = cVar10;
        }
        else {
          iVar9 = iVar9 + 1;
          if (cVar8 != cVar10) {
            iVar9 = 1;
          }
          if (iVar9 <= local_5f0) {
            std::__cxx11::string::push_back((char)&mappings);
          }
        }
        cVar10 = cVar8;
      }
      size = (uint32_t)
             mappings.super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
             super__Vector_impl_data._M_finish;
      _k = std::ostream::tellp();
      std::vector<ReadPosSize,std::allocator<ReadPosSize>>::emplace_back<long,unsigned_int&>
                ((vector<ReadPosSize,std::allocator<ReadPosSize>> *)&read_to_file_record,(long *)&k,
                 &size);
      std::ostream::write((char *)&ofs,
                          (long)mappings.
                                super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>
                                ._M_impl.super__Vector_impl_data._M_start);
      std::__cxx11::string::~string((string *)&mappings);
    }
    nReads = nReads + 1;
  }
  fPos = std::ostream::tellp();
  sdglib::write_flat_vector<ReadPosSize>(&ofs,&read_to_file_record);
  _k = _k & 0xffffffffffffff00;
  std::ostream::write((char *)&ofs,(long)&k);
  mappings.super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  mappings.super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  mappings.super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sdglib::write_flat_vector<LongReadMapping>(&ofs,&mappings);
  std::ostream::seekp(&ofs,6,0);
  std::ostream::write((char *)&ofs,(long)&nReads);
  std::ostream::write((char *)&ofs,(long)&fPos);
  std::ostream::flush();
  poVar4 = sdglib::OutputLog(INFO,true);
  poVar4 = std::operator<<(poVar4,"Built datastore with ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," reads");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::_Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>::~_Vector_base
            (&mappings.super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>);
  FastqRecord::~FastqRecord(&rec);
  FastqReader<FastqRecord>::~FastqReader(&reader);
  std::ifstream::~ifstream(&fastq_ifstream);
  std::ofstream::~ofstream(&ofs);
  std::_Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>::~_Vector_base
            (&read_to_file_record.super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>);
  return;
}

Assistant:

void LongReadsDatastore::build_from_fastq(const std::string &output_file, const std::string &default_name, const std::string &long_read_file, size_t min_size, int rle) {
    uint64_t nReads(1);
    std::vector<ReadPosSize> read_to_file_record{ReadPosSize{0,0}};
    std::ofstream ofs(output_file, std::ios_base::out | std::ios_base::trunc | std::ios_base::binary);
    if (!ofs) {
        std::cerr << "Failed to open output in " << output_file <<": " << strerror(errno);
        throw std::runtime_error("Could not open " + output_file);
    }
    uint64_t fPos;
    ofs.write((const char *) &SDG_MAGIC, sizeof(SDG_MAGIC));
    ofs.write((const char *) &SDG_VN, sizeof(min_compat));
    SDG_FILETYPE type(LongDS_FT);
    ofs.write((char *) &type, sizeof(type));

    ofs.write((char*) &nReads, sizeof(nReads));
    ofs.write((char*) &fPos, sizeof(fPos));

    sdglib::write_string(ofs, default_name);

    std::ifstream fastq_ifstream(long_read_file);
    if (!fastq_ifstream) {
        std::cerr << "Failed to open input in " << long_read_file << ": " << strerror(errno);
        throw std::runtime_error("Could not open " + long_read_file);
    }
    FastqReader<FastqRecord> reader({}, long_read_file);
    FastqRecord rec;
    while(reader.next_record(rec)) {
        if (!rec.seq.empty() and (min_size==0 or rec.seq.size()>=min_size)) {

            std::string rleseq;
            rleseq.reserve(rec.seq.size());
            char last_char=' ';
            int run_size=0;

            for (auto c:rec.seq){
                switch (c){
                    case 'A':
                    case 'C':
                    case 'G':
                    case 'T':
                        break;
                    case 'a':
                        c='A';
                        break;
                    case 'c':
                        c='C';
                        break;
                    case 'g':
                        c='G';
                        break;
                    case 't':
                        c='T';
                        break;
                    default:
                        c='N';
                }
                if (rle==0) {
                    rleseq.push_back(c);
                }
                else {
                    if (c==last_char) {
                        ++run_size;
                    }
                    else {
                        last_char=c;
                        run_size=1;
                    }
                    if (run_size<=rle) rleseq.push_back(c);
                }
            }

            uint32_t size = rleseq.size();
            auto offset = ofs.tellp();
            read_to_file_record.emplace_back((off_t)offset,size);
            ofs.write((char*)rleseq.c_str(), size+1);//+1 writes the \0

        }
        ++nReads;
    }
    fPos = ofs.tellp();                             // Write position after reads
    sdglib::write_flat_vector(ofs, read_to_file_record);

    // Write empty mappings
    uint8_t k(0);
    ofs.write(reinterpret_cast<const char *>(&k), sizeof(k));
    std::vector<LongReadMapping> mappings;
    sdglib::write_flat_vector(ofs, mappings);

    ofs.seekp(sizeof(SDG_MAGIC)+sizeof(SDG_VN)+sizeof(type));                                   // Go to top and dump # reads and position of index
    ofs.write((char*) &nReads, sizeof(nReads));     // Dump # of reads
    ofs.write((char*) &fPos, sizeof(fPos));         // Dump index

    ofs.flush();                                    // Make sure everything has been written
    sdglib::OutputLog(sdglib::LogLevels::INFO)<<"Built datastore with "<<read_to_file_record.size()-1<<" reads"<<std::endl;
}